

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Rendering.cpp
# Opt level: O3

void __thiscall Assimp::X3DImporter::ParseNode_Rendering_TriangleSet(X3DImporter *this)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  FIReader *pFVar3;
  char *pcVar4;
  CX3DImporter_NodeElement *pCVar5;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *plVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  undefined4 extraout_var;
  char *__s;
  undefined4 extraout_var_01;
  _List_node_base *p_Var10;
  CX3DImporter_NodeElement *pNode;
  string *psVar11;
  char *__end;
  int pAttrIdx;
  ulong uVar12;
  string an;
  CX3DImporter_NodeElement *ne;
  string def;
  string use;
  bool local_ac;
  bool local_ab;
  bool local_aa;
  bool local_a9;
  string local_a8;
  allocator local_81;
  CX3DImporter_NodeElement *local_80;
  uint local_74;
  string local_70;
  string local_50;
  undefined4 extraout_var_00;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_80 = (CX3DImporter_NodeElement *)0x0;
  uVar8 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  if ((int)uVar8 < 1) {
    local_ac = true;
    local_aa = true;
    local_ab = true;
    local_a9 = true;
  }
  else {
    uVar12 = 0;
    local_a9 = true;
    local_ab = true;
    local_aa = true;
    local_ac = true;
    local_74 = uVar8;
    do {
      pFVar3 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      pAttrIdx = (int)uVar12;
      iVar9 = (*(pFVar3->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                        (pFVar3,uVar12);
      std::__cxx11::string::string
                ((string *)&local_a8,(char *)CONCAT44(extraout_var,iVar9),&local_81);
      iVar9 = std::__cxx11::string::compare((char *)&local_a8);
      if (iVar9 == 0) {
        iVar9 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_00,iVar9);
        psVar11 = &local_70;
LAB_0069170f:
        pcVar4 = (char *)psVar11->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)psVar11,0,pcVar4,(ulong)__s);
        uVar8 = local_74;
      }
      else {
        iVar9 = std::__cxx11::string::compare((char *)&local_a8);
        if (iVar9 == 0) {
          iVar9 = (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_01,iVar9);
          psVar11 = &local_50;
          goto LAB_0069170f;
        }
        iVar9 = std::__cxx11::string::compare((char *)&local_a8);
        if (((iVar9 != 0) && (iVar9 = std::__cxx11::string::compare((char *)&local_a8), iVar9 != 0))
           && (iVar9 = std::__cxx11::string::compare((char *)&local_a8), iVar9 != 0)) {
          iVar9 = std::__cxx11::string::compare((char *)&local_a8);
          if (iVar9 == 0) {
            local_a9 = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
          }
          else {
            iVar9 = std::__cxx11::string::compare((char *)&local_a8);
            if (iVar9 == 0) {
              local_ab = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
            }
            else {
              iVar9 = std::__cxx11::string::compare((char *)&local_a8);
              if (iVar9 == 0) {
                local_ac = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
              }
              else {
                iVar9 = std::__cxx11::string::compare((char *)&local_a8);
                if (iVar9 == 0) {
                  local_aa = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
                }
                else {
                  Throw_IncorrectAttr(this,&local_a8);
                }
              }
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      uVar12 = (ulong)(pAttrIdx + 1U);
    } while (uVar8 != pAttrIdx + 1U);
  }
  if (local_50._M_string_length == 0) {
    pNode = (CX3DImporter_NodeElement *)operator_new(0xf0);
    pCVar5 = this->NodeElement_Cur;
    pNode->Type = ENET_TriangleSet;
    (pNode->ID)._M_dataplus._M_p = (pointer)&(pNode->ID).field_2;
    (pNode->ID)._M_string_length = 0;
    (pNode->ID).field_2._M_local_buf[0] = '\0';
    pNode->Parent = pCVar5;
    (pNode->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&pNode->Child;
    (pNode->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&pNode->Child;
    (pNode->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    *(CX3DImporter_NodeElement **)&pNode[1].Type = pNode + 1;
    pNode[1]._vptr_CX3DImporter_NodeElement = (_func_int **)(pNode + 1);
    pNode[1].ID._M_dataplus._M_p = (pointer)0x0;
    pNode[1].ID._M_string_length = 0;
    pNode[1].ID.field_2._M_local_buf[0] = '\x01';
    pNode->_vptr_CX3DImporter_NodeElement =
         (_func_int **)&PTR__CX3DImporter_NodeElement_IndexedSet_008ca8e0;
    *(undefined8 *)((long)&pNode[1].ID.field_2 + 8) = 0;
    pNode[1].Parent = (CX3DImporter_NodeElement *)0x0;
    pNode[1].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
    pNode[1].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    pNode[2]._vptr_CX3DImporter_NodeElement = (_func_int **)0x0;
    *(undefined8 *)&pNode[2].Type = 0;
    pNode[2].ID._M_string_length = 0;
    pNode[2].ID.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&pNode[2].ID.field_2 + 8) = 0;
    pNode[2].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    pNode[2].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
    pNode[2].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    local_80 = pNode;
    if (local_70._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&pNode->ID);
    }
    pNode[1].ID.field_2._M_local_buf[1] = local_a9;
    pNode[1].ID.field_2._M_local_buf[2] = local_ab;
    pNode[1].ID.field_2._M_local_buf[3] = local_ac;
    pNode[1].ID.field_2._M_local_buf[0] = local_aa;
    iVar9 = (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    if ((char)iVar9 == '\0') {
      ParseHelper_Node_Enter(this,pNode);
      paVar2 = &local_a8.field_2;
      do {
        do {
          while( true ) {
            iVar9 = (*(((this->mReader)._M_t.
                        super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                        .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                      super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[2])();
            if ((char)iVar9 == '\0') {
              local_a8._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"TriangleSet","");
              Throw_CloseNotFound(this,&local_a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != paVar2) {
                operator_delete(local_a8._M_dataplus._M_p);
              }
              goto LAB_00691c3f;
            }
            iVar9 = (*(((this->mReader)._M_t.
                        super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                        .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                      super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
            if (iVar9 != 1) break;
            local_a8._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Color","");
            (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
            iVar9 = std::__cxx11::string::compare((char *)&local_a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != paVar2) {
              operator_delete(local_a8._M_dataplus._M_p);
            }
            if (iVar9 == 0) {
              ParseNode_Rendering_Color(this);
            }
            else {
              local_a8._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"ColorRGBA","");
              (*(((this->mReader)._M_t.
                  super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                  .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
              iVar9 = std::__cxx11::string::compare((char *)&local_a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != paVar2) {
                operator_delete(local_a8._M_dataplus._M_p);
              }
              if (iVar9 == 0) {
                ParseNode_Rendering_ColorRGBA(this);
              }
              else {
                local_a8._M_dataplus._M_p = (pointer)paVar2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Coordinate","")
                ;
                (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
                iVar9 = std::__cxx11::string::compare((char *)&local_a8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a8._M_dataplus._M_p != paVar2) {
                  operator_delete(local_a8._M_dataplus._M_p);
                }
                if (iVar9 == 0) {
                  ParseNode_Rendering_Coordinate(this);
                }
                else {
                  local_a8._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Normal","");
                  (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
                  iVar9 = std::__cxx11::string::compare((char *)&local_a8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p != paVar2) {
                    operator_delete(local_a8._M_dataplus._M_p);
                  }
                  if (iVar9 == 0) {
                    ParseNode_Rendering_Normal(this);
                  }
                  else {
                    local_a8._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_a8,"TextureCoordinate","");
                    (*(((this->mReader)._M_t.
                        super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                        .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                      super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
                    iVar9 = std::__cxx11::string::compare((char *)&local_a8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_a8._M_dataplus._M_p != paVar2) {
                      operator_delete(local_a8._M_dataplus._M_p);
                    }
                    if (iVar9 == 0) {
                      ParseNode_Texturing_TextureCoordinate(this);
                    }
                    else {
                      bVar7 = ParseHelper_CheckRead_X3DMetadataObject(this);
                      if (!bVar7) {
                        local_a8._M_dataplus._M_p = (pointer)paVar2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_a8,"TriangleSet","");
                        XML_CheckNode_SkipUnsupported(this,&local_a8);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_a8._M_dataplus._M_p != paVar2) {
                          operator_delete(local_a8._M_dataplus._M_p);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          iVar9 = (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
        } while (iVar9 != 2);
        local_a8._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"TriangleSet","");
        (*(((this->mReader)._M_t.
            super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
            super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
            super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
          super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xd])();
        iVar9 = std::__cxx11::string::compare((char *)&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar2) {
          operator_delete(local_a8._M_dataplus._M_p);
        }
      } while (iVar9 != 0);
LAB_00691c3f:
      ParseHelper_Node_Exit(this);
    }
    else {
      pCVar5 = this->NodeElement_Cur;
      p_Var10 = (_List_node_base *)operator_new(0x18);
      p_Var10[1]._M_next = (_List_node_base *)pNode;
      std::__detail::_List_node_base::_M_hook(p_Var10);
      psVar1 = &(pCVar5->Child).
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    p_Var10 = (_List_node_base *)operator_new(0x18);
    p_Var10[1]._M_next = (_List_node_base *)pNode;
    std::__detail::_List_node_base::_M_hook(p_Var10);
    plVar6 = &this->NodeElement_List;
  }
  else {
    XML_CheckNode_MustBeEmpty(this);
    if (local_70._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar7 = FindNodeElement(this,&local_50,ENET_TriangleSet,&local_80);
    if (!bVar7) {
      Throw_USE_NotFound(this,&local_50);
    }
    pCVar5 = this->NodeElement_Cur;
    p_Var10 = (_List_node_base *)operator_new(0x18);
    p_Var10[1]._M_next = (_List_node_base *)local_80;
    std::__detail::_List_node_base::_M_hook(p_Var10);
    plVar6 = &pCVar5->Child;
  }
  psVar1 = &(plVar6->
            super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void X3DImporter::ParseNode_Rendering_TriangleSet()
{
    std::string use, def;
    bool ccw = true;
    bool colorPerVertex = true;
    bool normalPerVertex = true;
    bool solid = true;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("ccw", ccw, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("colorPerVertex", colorPerVertex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("normalPerVertex", normalPerVertex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_TriangleSet, ne);
	}
	else
	{
		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_IndexedSet(CX3DImporter_NodeElement::ENET_TriangleSet, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		CX3DImporter_NodeElement_Set& ne_alias = *((CX3DImporter_NodeElement_Set*)ne);

		ne_alias.CCW = ccw;
		ne_alias.ColorPerVertex = colorPerVertex;
		ne_alias.NormalPerVertex = normalPerVertex;
		ne_alias.Solid = solid;
        // check for child nodes
        if(!mReader->isEmptyElement())
        {
			ParseHelper_Node_Enter(ne);
			MACRO_NODECHECK_LOOPBEGIN("TriangleSet");
				// check for X3DComposedGeometryNodes
				if(XML_CheckNode_NameEqual("Color")) { ParseNode_Rendering_Color(); continue; }
				if(XML_CheckNode_NameEqual("ColorRGBA")) { ParseNode_Rendering_ColorRGBA(); continue; }
				if(XML_CheckNode_NameEqual("Coordinate")) { ParseNode_Rendering_Coordinate(); continue; }
				if(XML_CheckNode_NameEqual("Normal")) { ParseNode_Rendering_Normal(); continue; }
				if(XML_CheckNode_NameEqual("TextureCoordinate")) { ParseNode_Texturing_TextureCoordinate(); continue; }
				// check for X3DMetadataObject
				if(!ParseHelper_CheckRead_X3DMetadataObject()) XML_CheckNode_SkipUnsupported("TriangleSet");

			MACRO_NODECHECK_LOOPEND("TriangleSet");
			ParseHelper_Node_Exit();
		}// if(!mReader->isEmptyElement())
		else
		{
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element
		}

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}